

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_standard_logger__on_test_skip(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RSI;
  char *in_RDI;
  char msg [256];
  char *name;
  char *condition;
  char acStack_128 [200];
  
  uVar1 = *(undefined8 *)(in_RSI + 0x28);
  uVar2 = *(undefined8 *)(in_RSI + 0x30);
  memset(acStack_128,0,0x100);
  fct_snprintf(acStack_128,0x100,"%s (%s)",uVar2,uVar1);
  fct_dotted_line_start(msg._0_8_,in_RDI);
  fct_dotted_line_end((char *)0x105d85);
  return;
}

Assistant:

static void
fct_standard_logger__on_test_skip(
    fct_logger_i* logger_,
    fct_logger_evt_t const *e
)
{
    char const *condition = e->cndtn;
    char const *name = e->name;
    char msg[256] = {'\0'};
    fct_unused(logger_);
    fct_unused(condition);
    fct_snprintf(msg, sizeof(msg), "%s (%s)", name, condition);
    msg[sizeof(msg)-1] = '\0';
    fct_dotted_line_start(FCT_STANDARD_LOGGER_MAX_LINE, msg);
    fct_dotted_line_end("- SKIP -");
}